

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Television.cpp
# Opt level: O3

void __thiscall L15_1::Television::settings(Television *this)

{
  long *plVar1;
  char *pcVar2;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TV is ",6);
  bVar3 = this->_state == 1;
  pcVar2 = "Off";
  if (bVar3) {
    pcVar2 = "On";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,(ulong)bVar3 ^ 3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  if (this->_state == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Volume setting = ",0x11);
    plVar1 = (long *)std::ostream::operator<<(&std::cout,this->_volume);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Channel setting = ",0x12);
    plVar1 = (long *)std::ostream::operator<<(&std::cout,this->_channel);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Mode = ",7);
    bVar3 = this->_mode == 0;
    pcVar2 = "Cable";
    if (bVar3) {
      pcVar2 = "Antenna";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar2,(ulong)bVar3 * 2 + 5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Input = ",8);
    bVar3 = this->_input == 0;
    pcVar2 = "DVD";
    if (bVar3) {
      pcVar2 = "TV";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar2,(ulong)bVar3 ^ 3);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void Television::settings() const {
        std::cout << "TV is " << (_state == On ? "On" : "Off") << std::endl;
        if (_state == On) {
            std::cout << "Volume setting = " << _volume << std::endl;
            std::cout << "Channel setting = " << _channel << std::endl;
            std::cout << "Mode = " << (_mode == Antenna ? "Antenna" : "Cable") << std::endl;
            std::cout << "Input = " << (_input == TV ? "TV" : "DVD") << std::endl;
        }
    }